

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkcookie.cpp
# Opt level: O1

bool __thiscall QNetworkCookie::operator==(QNetworkCookie *this,QNetworkCookie *other)

{
  QNetworkCookiePrivate *pQVar1;
  QNetworkCookiePrivate *pQVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  long in_FS_OFFSET;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  QStringView QVar13;
  QDateTime local_40 [8];
  QDateTime local_38 [8];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (other->d).d.ptr;
  pQVar2 = (this->d).d.ptr;
  if (pQVar2 == pQVar1) {
    bVar6 = true;
    goto LAB_00186a1b;
  }
  bVar6 = ::operator==(&pQVar2->name,&pQVar1->name);
  if (bVar6) {
    bVar6 = ::operator==(&((this->d).d.ptr)->value,&((other->d).d.ptr)->value);
    if (!bVar6) goto LAB_001869fa;
    QDateTime::toUTC();
    QDateTime::toUTC();
    cVar7 = QDateTime::equals(local_38);
    bVar6 = true;
    bVar5 = true;
    if (cVar7 == '\0') goto LAB_001869fc;
    pQVar1 = (this->d).d.ptr;
    pQVar2 = (other->d).d.ptr;
    lVar3 = (pQVar1->domain).d.size;
    lVar4 = (pQVar2->domain).d.size;
    if (lVar3 != lVar4) goto LAB_001869fc;
    QVar8.m_data = (pQVar1->domain).d.ptr;
    QVar8.m_size = lVar3;
    QVar11.m_data = (pQVar2->domain).d.ptr;
    QVar11.m_size = lVar4;
    cVar7 = QtPrivate::equalStrings(QVar8,QVar11);
    if (cVar7 == '\0') goto LAB_001869fc;
    lVar3 = (pQVar1->path).d.size;
    lVar4 = (pQVar2->path).d.size;
    if (lVar3 != lVar4) goto LAB_001869fc;
    QVar9.m_data = (pQVar1->path).d.ptr;
    QVar9.m_size = lVar3;
    QVar12.m_data = (pQVar2->path).d.ptr;
    QVar12.m_size = lVar4;
    cVar7 = QtPrivate::equalStrings(QVar9,QVar12);
    if ((cVar7 == '\0') || (pQVar1->secure != pQVar2->secure)) goto LAB_001869fc;
    lVar3 = (pQVar1->comment).d.size;
    lVar4 = (pQVar2->comment).d.size;
    if (lVar3 != lVar4) goto LAB_001869fc;
    QVar10.m_data = (pQVar1->comment).d.ptr;
    QVar10.m_size = lVar3;
    QVar13.m_data = (pQVar2->comment).d.ptr;
    QVar13.m_size = lVar4;
    cVar7 = QtPrivate::equalStrings(QVar10,QVar13);
    if (cVar7 == '\0') goto LAB_001869fc;
    bVar6 = pQVar1->sameSite == pQVar2->sameSite;
  }
  else {
LAB_001869fa:
    bVar6 = false;
LAB_001869fc:
    bVar5 = bVar6;
    bVar6 = false;
  }
  if (bVar5) {
    QDateTime::~QDateTime(local_40);
    QDateTime::~QDateTime(local_38);
  }
LAB_00186a1b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool QNetworkCookie::operator==(const QNetworkCookie &other) const
{
    if (d == other.d)
        return true;
    return d->name == other.d->name &&
        d->value == other.d->value &&
        d->expirationDate.toUTC() == other.d->expirationDate.toUTC() &&
        d->domain == other.d->domain &&
        d->path == other.d->path &&
        d->secure == other.d->secure &&
        d->comment == other.d->comment &&
        d->sameSite == other.d->sameSite;
}